

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O1

void __thiscall helics::Publication::publishComplex(Publication *this,double *vals,int size)

{
  bool bVar1;
  ulong uVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> CV;
  SmallBuffer db;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_e8;
  SmallBuffer local_c8;
  data_view local_68;
  data_view local_48;
  
  if (this->changeDetectionEnabled == true) {
    local_e8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (&local_e8,(long)size);
    if (0 < size) {
      uVar2 = (ulong)(uint)size;
      do {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_e8,
                   vals,vals + 1);
        vals = vals + 2;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    bVar1 = changeDetected(&this->prevValue,&local_e8,this->delta);
    if (bVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                   *)&this->prevValue,&local_e8);
      typeConvert(&local_c8,this->pubType,&local_e8);
      local_48.dblock._M_len = local_c8.bufferSize;
      local_48.dblock._M_str = (char *)local_c8.heap;
      local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::ValueFederate::publishBytes(this->fed,this,&local_48);
      if (local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.ref.
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (((local_c8.usingAllocatedBuffer == true) && (local_c8.nonOwning == false)) &&
         (local_c8.heap != (byte *)0x0)) {
        operator_delete__(local_c8.heap);
      }
    }
    if (local_e8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    typeConvertComplex(&local_c8,this->pubType,vals,(long)size);
    local_68.dblock._M_len = local_c8.bufferSize;
    local_68.dblock._M_str = (char *)local_c8.heap;
    local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_68);
    if (local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((local_c8.usingAllocatedBuffer == true) && (local_c8.nonOwning == false)) &&
       (local_c8.heap != (byte *)0x0)) {
      operator_delete__(local_c8.heap);
    }
  }
  return;
}

Assistant:

void Publication::publishComplex(const double* vals, int size)
{
    if (changeDetectionEnabled) {
        std::vector<std::complex<double>> CV;
        CV.reserve(size);
        for (int ii = 0; ii < size; ++ii) {
            CV.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
        }
        if (changeDetected(prevValue, CV, delta)) {
            prevValue = CV;
            auto db = typeConvert(pubType, CV);
            fed->publishBytes(*this, db);
        }
    } else {
        auto db = typeConvertComplex(pubType, vals, size);
        fed->publishBytes(*this, db);
    }
}